

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::StringOutputTask::checkArguments
          (StringOutputTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *arg;
  reference ppEVar2;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  ASTContext *in_R8;
  undefined8 in_R9;
  undefined1 isMethod;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  Type *ft;
  Compilation *comp;
  Type *this_01;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff70;
  SourceRange in_stack_ffffffffffffff80;
  SourceLocation SVar3;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_R9 >> 0x38);
  SVar3 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x93698b);
  this_01 = (Type *)0x7fffffff;
  callRange.endLoc = in_RCX;
  callRange.startLoc = SVar3;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,(bool)isMethod,(Args *)this_00,callRange,unaff_retaddr,
                     in_stack_00000008);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    arg = not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x936a13);
    bVar1 = Type::canBeStringLike(this_01);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                (in_stack_ffffffffffffff70,(size_type)in_RSI,(size_type)this_01);
      bVar1 = FmtHelpers::checkDisplayArgs(in_R8,(Args *)in_RCX);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_8 = Compilation::getVoidType(this_00);
      }
      else {
        local_8 = Compilation::getErrorType(this_00);
      }
    }
    else {
      ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           in_RDX,0);
      ASTContext::addDiag((ASTContext *)in_RDI,SUB84(((*ppEVar2)->sourceRange).startLoc,4),
                          in_stack_ffffffffffffff80);
      ast::operator<<((Diagnostic *)in_RCX,arg);
      local_8 = Compilation::getErrorType(this_00);
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, INT32_MAX))
            return comp.getErrorType();

        const Type& ft = *args[0]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << ft;
            return comp.getErrorType();
        }

        if (!FmtHelpers::checkDisplayArgs(context, args.subspan(1)))
            return comp.getErrorType();

        return comp.getVoidType();
    }